

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ans_int.hpp
# Opt level: O1

void __thiscall ans_int_decode::~ans_int_decode(ans_int_decode *this)

{
  pointer puVar1;
  pointer puVar2;
  
  puVar1 = (this->table).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (puVar1 != (pointer)0x0) {
    operator_delete(puVar1,(long)(this->table).
                                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                 _M_impl.super__Vector_impl_data._M_end_of_storage - (long)puVar1);
  }
  puVar2 = (this->nfreqs).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (puVar2 != (pointer)0x0) {
    operator_delete(puVar2,(long)(this->nfreqs).
                                 super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                 _M_impl.super__Vector_impl_data._M_end_of_storage - (long)puVar2);
    return;
  }
  return;
}

Assistant:

static ans_int_decode load(const uint8_t* in_u8)
    {
        ans_int_decode model;
        model.nfreqs = ans_load_interp(in_u8);
        auto max_norm_freq
            = *std::max_element(model.nfreqs.begin(), model.nfreqs.end());
        model.frame_size = std::accumulate(
            std::begin(model.nfreqs), std::end(model.nfreqs), 0);
        model.frame_mask = model.frame_size - 1;
        model.frame_log2 = log2(model.frame_size);
        auto max_sym = model.nfreqs.size() - 1;
        uint64_t tmp = constants::K * constants::RADIX;
        uint32_t cur_base = 0;
        if (max_norm_freq <= std::numeric_limits<uint16_t>::max()) {
            model.table.resize(model.frame_size * sizeof(dec_entry_int_small));
            model.table_type = dec_table_type::SMALL;
            auto table
                = reinterpret_cast<dec_entry_int_small*>(model.table.data());
            for (size_t sym = 0; sym <= max_sym; sym++) {
                auto cur_freq = model.nfreqs[sym];
                for (uint32_t k = 0; k < cur_freq; k++) {
                    dec_entry_int_small* entry = table + cur_base + k;
                    entry->freq = cur_freq;
                    entry->sym = sym;
                    entry->offset = k;
                }
                cur_base += model.nfreqs[sym];
            }
        } else {
            model.table.resize(model.frame_size * sizeof(dec_entry_int));
            model.table_type = dec_table_type::LARGE;
            auto table = reinterpret_cast<dec_entry_int*>(model.table.data());
            for (size_t sym = 0; sym <= max_sym; sym++) {
                auto cur_freq = model.nfreqs[sym];
                if (cur_freq == 0)
                    continue;
                for (uint32_t k = 0; k < cur_freq; k++) {
                    dec_entry_int* entry = table + cur_base + k;
                    table[cur_base + k].freq = cur_freq;
                    table[cur_base + k].sym = sym;
                    table[cur_base + k].offset = k;
                }
                dec_entry_int* entry = table + cur_base;
                cur_base += model.nfreqs[sym];
            }
        }
        model.lower_bound = constants::K * model.frame_size;
        return model;
    }